

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O2

VectorXd __thiscall RadarMeasurement::InitializeState(RadarMeasurement *this,int n)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  int in_EDX;
  DenseIndex extraout_RDX;
  undefined4 in_register_00000034;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *this_00;
  double dVar4;
  double dVar5;
  VectorXd VVar6;
  Scalar local_18;
  
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(long)in_EDX);
  local_18 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&local_18);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
            (CONCAT44(in_register_00000034,n) + 0x18);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](this_00,0);
  dVar1 = *pdVar2;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](this_00,1);
  dVar5 = *pdVar2;
  dVar4 = cos(dVar5);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
  *pSVar3 = dVar4 * dVar1;
  dVar5 = sin(dVar5);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
  *pSVar3 = dVar1 * dVar5;
  VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd RadarMeasurement::InitializeState(int n) const {

    VectorXd x(n);
    // initialize the state vector
    x.fill(1.0);
    double rho = measurements_[0];
    double phi = measurements_[1];
    x(0) = rho * cos(phi);
    x(1) = rho * sin(phi);
    //x(0) = (fabs(rho)<0.001) ? 0.01 : rho * cos(phi);
    //x(1) = (fabs(rho)<0.001) ? 0.01 : rho * sin(phi);
    // TODO: redo equations here:
    // v: rho dot is actually a predo equations here:rojection of v to vector rho.  
    // psi: the is angle between vy and v
    //x(2) = measurements_[2];
    //x(3) = phi; 
    return x;
}